

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall gnilk::LogManager::AddSink(LogManager *this,LogSink *sink,string *name)

{
  __uniq_ptr_data<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>,_true,_true>
  in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_gnilk::LogSinkInstance_*,_false> local_28;
  
  local_28._M_head_impl =
       (LogSinkInstance *)
       in_RAX.
       super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>.
       _M_t.
       super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
       .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl;
  std::mutex::lock(&this->sinkLock);
  LogSinkInstanceUnmanaged::Create((LogSinkInstanceUnmanaged *)&stack0xffffffffffffffd8,sink,name);
  std::
  vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>
  ::
  emplace_back<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>
            ((vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>
              *)&this->sinks,
             (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
             &stack0xffffffffffffffd8);
  if (this->isInitialized == true) {
    (*sink->_vptr_LogSink[8])(sink);
  }
  if ((_Head_base<0UL,_gnilk::LogSinkInstance_*,_false>)local_28._M_head_impl !=
      (_Head_base<0UL,_gnilk::LogSinkInstance_*,_false>)0x0) {
    (*(local_28._M_head_impl)->_vptr_LogSinkInstance[1])();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sinkLock);
  return;
}

Assistant:

void LogManager::AddSink(LogSink *sink, const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);
    auto sinkInstance = LogSinkInstanceUnmanaged::Create(sink, name);
    sinks.push_back(std::move(sinkInstance));
    // FIXME: This is not good - we can't do this during initialization
    if (isInitialized) {
        sink->OnAttached();
    }
}